

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O0

void Abc_TtCopy(word *pOut,word *pIn,int nWords,int fCompl)

{
  int local_24;
  int w;
  int fCompl_local;
  int nWords_local;
  word *pIn_local;
  word *pOut_local;
  
  if (fCompl == 0) {
    for (local_24 = 0; local_24 < nWords; local_24 = local_24 + 1) {
      pOut[local_24] = pIn[local_24];
    }
  }
  else {
    for (local_24 = 0; local_24 < nWords; local_24 = local_24 + 1) {
      pOut[local_24] = pIn[local_24] ^ 0xffffffffffffffff;
    }
  }
  return;
}

Assistant:

static inline void Abc_TtCopy( word * pOut, word * pIn, int nWords, int fCompl )
{
    int w;
    if ( fCompl )
        for ( w = 0; w < nWords; w++ )
            pOut[w] = ~pIn[w];
    else
        for ( w = 0; w < nWords; w++ )
            pOut[w] = pIn[w];
}